

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

bool __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::span<const_char,_18446744073709551615UL>_>_>_>
::next_byte_in_range
          (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::span<const_char,_18446744073709551615UL>_>_>_>
           *this,initializer_list<int> ranges)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  bool bVar4;
  ulong uVar5;
  int *piVar6;
  const_iterator range;
  bool bVar7;
  
  uVar5 = ranges._M_len;
  piVar6 = ranges._M_array;
  if ((6 < uVar5) || ((0x54UL >> (uVar5 & 0x3f) & 1) == 0)) {
    __assert_fail("ranges.size() == 2 || ranges.size() == 4 || ranges.size() == 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/moonshadow565[P]ritobin/ritobin_lib/deps/json.hpp"
                  ,0x17ca,
                  "bool nlohmann::detail::lexer<nlohmann::basic_json<>, nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::span<const char>>>>::next_byte_in_range(std::initializer_list<char_int_type>) [BasicJsonType = nlohmann::basic_json<>, InputAdapterType = nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::span<const char>>>]"
                 );
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&this->token_buffer,(char)this->current);
  bVar7 = uVar5 == 0;
  if (!bVar7) {
    piVar2 = piVar6 + uVar5;
    do {
      get(this);
      iVar3 = this->current;
      if (iVar3 < *piVar6) {
        bVar4 = false;
      }
      else {
        piVar1 = piVar6 + 1;
        piVar6 = piVar6 + 1;
        bVar4 = iVar3 <= *piVar1;
      }
      if (!bVar4) {
        this->error_message = "invalid string: ill-formed UTF-8 byte";
        return bVar7;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&this->token_buffer,(char)iVar3);
      piVar6 = piVar6 + 1;
      bVar7 = piVar6 == piVar2;
    } while (!bVar7);
  }
  return bVar7;
}

Assistant:

bool next_byte_in_range(std::initializer_list<char_int_type> ranges)
    {
        JSON_ASSERT(ranges.size() == 2 || ranges.size() == 4 || ranges.size() == 6);
        add(current);

        for (auto range = ranges.begin(); range != ranges.end(); ++range)
        {
            get();
            if (JSON_HEDLEY_LIKELY(*range <= current && current <= *(++range)))
            {
                add(current);
            }
            else
            {
                error_message = "invalid string: ill-formed UTF-8 byte";
                return false;
            }
        }

        return true;
    }